

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O0

void __thiscall
Refal2::CQualifierParser::CQualifierParser(CQualifierParser *this,IErrorHandler *errorHandler)

{
  IErrorHandler *errorHandler_local;
  CQualifierParser *this_local;
  
  CModuleBuilder::CModuleBuilder(&this->super_CModuleBuilder,errorHandler);
  CParsingElementState::CParsingElementState(&this->super_CParsingElementState);
  CToken::CToken(&this->token);
  CQualifierBuilder::CQualifierBuilder(&this->builder);
  CToken::CToken(&this->namedQualifier);
  Reset(this);
  return;
}

Assistant:

CQualifierParser::CQualifierParser( IErrorHandler* errorHandler ):
	CModuleBuilder( errorHandler )
{
	Reset();
}